

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O2

int bitset_container_index_equalorlarger(bitset_container_t *container,uint16_t x)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  undefined6 in_register_00000032;
  ulong uVar4;
  uint64_t uVar5;
  
  uVar3 = (uint)CONCAT62(in_register_00000032,x);
  uVar4 = (ulong)(uVar3 >> 6);
  uVar5 = (container->words[uVar4] >> ((byte)x & 0x3f)) << ((byte)x & 0x3f);
  iVar2 = -(uVar3 & 0xffffffc0);
  while( true ) {
    if (uVar5 != 0) {
      lVar1 = 0;
      if (uVar5 != 0) {
        for (; (uVar5 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
        }
      }
      return (int)lVar1 - iVar2;
    }
    if (uVar4 == 0x3ff) break;
    uVar5 = container->words[uVar4 + 1];
    iVar2 = iVar2 + -0x40;
    uVar4 = uVar4 + 1;
  }
  return -1;
}

Assistant:

int bitset_container_index_equalorlarger(const bitset_container_t *container, uint16_t x) {
  uint32_t x32 = x;
  uint32_t k = x32 / 64;
  uint64_t word = container->words[k];
  const int diff = x32 - k * 64; // in [0,64)
  word = (word >> diff) << diff; // a mask is faster, but we don't care
  while(word == 0) {
    k++;
    if(k == BITSET_CONTAINER_SIZE_IN_WORDS) return -1;
    word = container->words[k];
  }
  return k * 64 + roaring_trailing_zeroes(word);
}